

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

void Util::inner::join_helper<char_const*,std::__cxx11::string_const&>
               (ostringstream *stream,char **t,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts)

{
  std::operator<<((ostream *)stream,*t);
  std::operator<<((ostream *)stream,(string *)ts);
  return;
}

Assistant:

void join_helper(std::ostringstream &stream, T &&t, Ts &&... ts)
{
	stream << std::forward<T>(t);
	join_helper(stream, std::forward<Ts>(ts)...);
}